

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapAsyncFunction
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  JavascriptAsyncFunction *pJVar1;
  SnapGeneratorFunctionInfo *pSVar2;
  GeneratorVirtualScriptFunction *ptr;
  
  pJVar1 = Js::VarTo<Js::JavascriptAsyncFunction,Js::RecyclableObject>(obj);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapGeneratorFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)36>
                     (snpObject);
  if (pSVar2->scriptFunction != 0) {
    ptr = (GeneratorVirtualScriptFunction *)
          InflateMap::LookupObject(inflator,pSVar2->scriptFunction);
    Memory::WriteBarrierPtr<Js::GeneratorVirtualScriptFunction>::WriteBarrierSet
              (&(pJVar1->super_JavascriptGeneratorFunction).scriptFunction,ptr);
    return;
  }
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapAsyncFunction(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            Js::JavascriptAsyncFunction* func = Js::VarTo<Js::JavascriptAsyncFunction>(obj);
            SnapGeneratorFunctionInfo* info = SnapObjectGetAddtlInfoAs<SnapGeneratorFunctionInfo *, SnapObjectType::SnapAsyncFunction>(snpObject);

            if (info->scriptFunction != TTD_INVALID_PTR_ID)
            {
                Js::GeneratorVirtualScriptFunction* gvsf = reinterpret_cast<Js::GeneratorVirtualScriptFunction*>(inflator->LookupObject(info->scriptFunction));
                func->SetScriptFunction(gvsf);
            }
        }